

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

bool __thiscall
slang::ast::FormalArgumentSymbol::mergeVariable(FormalArgumentSymbol *this,VariableSymbol *variable)

{
  bool bVar1;
  SyntaxNode *this_00;
  DataTypeSyntax *pDVar2;
  DeclaredType *pDVar3;
  Scope *in_RSI;
  Symbol *in_RDI;
  VariablePortHeaderSyntax *header;
  PortDeclarationSyntax *portDecl;
  SyntaxNode *syntax;
  ValueSymbol *in_stack_ffffffffffffffa8;
  bitmask<slang::ast::DeclaredTypeFlags> local_3c;
  DeclaredType *local_38;
  VariablePortHeaderSyntax *local_30;
  PortDeclarationSyntax *local_28;
  SyntaxNode *local_20;
  Scope *local_18;
  bitmask<slang::ast::DeclaredTypeFlags> toAdd;
  
  if ((in_RDI[5].parentScope == (Scope *)0x0) &&
     (local_18 = in_RSI, local_20 = Symbol::getSyntax(in_RDI),
     local_20->parent->kind == PortDeclaration)) {
    local_28 = slang::syntax::SyntaxNode::as<slang::syntax::PortDeclarationSyntax>(local_20->parent)
    ;
    this_00 = &not_null<slang::syntax::PortHeaderSyntax_*>::operator->
                         ((not_null<slang::syntax::PortHeaderSyntax_*> *)0x10c9ae9)->
               super_SyntaxNode;
    local_30 = slang::syntax::SyntaxNode::as<slang::syntax::VariablePortHeaderSyntax>(this_00);
    bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x10c9b04);
    if ((!bVar1) &&
       (pDVar2 = not_null<slang::syntax::DataTypeSyntax_*>::operator->
                           ((not_null<slang::syntax::DataTypeSyntax_*> *)0x10c9b16),
       (pDVar2->super_ExpressionSyntax).super_SyntaxNode.kind == ImplicitType)) {
      local_38 = (DeclaredType *)ValueSymbol::getDeclaredType(in_stack_ffffffffffffffa8);
      pDVar3 = not_null<slang::ast::DeclaredType_*>::operator->
                         ((not_null<slang::ast::DeclaredType_*> *)0x10c9b3e);
      toAdd.m_bits = (underlying_type)((ulong)pDVar3 >> 0x20);
      bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_3c,FormalArgMergeVar);
      DeclaredType::addFlags((DeclaredType *)in_stack_ffffffffffffffa8,toAdd);
      in_RDI[5].parentScope = local_18;
      return true;
    }
  }
  return false;
}

Assistant:

bool FormalArgumentSymbol::mergeVariable(const VariableSymbol& variable) {
    // If we've already merged one variable already, we can't do any more.
    if (mergedVar)
        return false;

    auto syntax = getSyntax();
    SLANG_ASSERT(syntax && syntax->parent);
    if (syntax->parent->kind != SyntaxKind::PortDeclaration)
        return false;

    auto& portDecl = syntax->parent->as<PortDeclarationSyntax>();
    auto& header = portDecl.header->as<VariablePortHeaderSyntax>();

    // If the port has a type declared this is already a full definition and
    // we shouldn't merge with any other variables (the caller will error for us).
    if (header.varKeyword || header.dataType->kind != SyntaxKind::ImplicitType)
        return false;

    // Save this variable reference; our DeclaredType will look into it later
    // when our type is fully resolved to merge in the variable's type info.
    getDeclaredType()->addFlags(DeclaredTypeFlags::FormalArgMergeVar);
    mergedVar = &variable;
    return true;
}